

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Vrc6.cpp
# Opt level: O0

void __thiscall Nes_Vrc6::reset(Nes_Vrc6 *this)

{
  int j;
  Vrc6_Osc *osc;
  int i;
  Nes_Vrc6 *this_local;
  
  this->last_time = 0;
  for (i = 0; i < 3; i = i + 1) {
    for (j = 0; j < 3; j = j + 1) {
      this->oscs[i].regs[j] = '\0';
    }
    this->oscs[i].delay = 0;
    this->oscs[i].last_amp = 0;
    this->oscs[i].phase = 1;
    this->oscs[i].amp = 0;
  }
  return;
}

Assistant:

void Nes_Vrc6::reset()
{
	last_time = 0;
	for ( int i = 0; i < osc_count; i++ )
	{
		Vrc6_Osc& osc = oscs [i];
		for ( int j = 0; j < reg_count; j++ )
			osc.regs [j] = 0;
		osc.delay = 0;
		osc.last_amp = 0;
		osc.phase = 1;
		osc.amp = 0;
	}
}